

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

void pzshape::TPZShapeQuad::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int *piVar5;
  double *pdVar6;
  TPZVec<int> *in_RSI;
  TPZFMatrix<double> *this;
  int is;
  double in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  double dVar7;
  TPZFMatrix<double> *in_stack_ffffffffffffff40;
  undefined4 local_24;
  
  for (local_24 = 4; local_24 < 8; local_24 = local_24 + 1) {
    piVar5 = TPZVec<int>::operator[](in_RSI,(long)local_24 + -4);
    if (0 < *piVar5) {
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar7 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      *pdVar6 = dVar7 * dVar1;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar7 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar2 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar3 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      *pdVar6 = dVar7 * dVar1 + dVar2 * dVar3;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar7 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar2 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      dVar3 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int64_t)in_stack_ffffffffffffff30);
      *pdVar6 = dVar7 * dVar1 + dVar2 * dVar3;
    }
  }
  pdVar6 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                      (int64_t)in_stack_ffffffffffffff30);
  dVar7 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff40,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  this = (TPZFMatrix<double> *)(dVar7 * *pdVar6);
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  *pdVar6 = (double)this;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  dVar1 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  dVar2 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  dVar3 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  dVar4 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  *pdVar6 = dVar1 * dVar2 + dVar3 * dVar4;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  dVar1 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  dVar2 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  dVar3 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  dVar4 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  *pdVar6 = dVar1 * dVar2 + dVar3 * dVar4;
  for (local_24 = 4; local_24 < 8; local_24 = local_24 + 1) {
    piVar5 = TPZVec<int>::operator[](in_RSI,(long)local_24 + -4);
    if (0 < *piVar5) {
      pdVar6 = TPZFMatrix<double>::operator()
                         (this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
      *pdVar6 = dVar1 + *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
      *pdVar6 = dVar1 + *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff30 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
      *pdVar6 = in_stack_ffffffffffffff30 + *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
      *pdVar6 = *pdVar6 * 4.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
      *pdVar6 = *pdVar6 * 4.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
      *pdVar6 = *pdVar6 * 4.0;
    }
  }
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  *pdVar6 = *pdVar6 * 16.0;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  *pdVar6 = *pdVar6 * 16.0;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)dVar7,(int64_t)in_stack_ffffffffffffff30);
  *pdVar6 = *pdVar6 * 16.0;
  return;
}

Assistant:

void TPZShapeQuad::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        int is;
        for(is=4; is<8; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            phi(is,0) = phi(is%4,0)*phi((is+1)%4,0);
            dphi(0,is) = dphi(0,is%4)*phi((is+1)%4,0)+phi(is%4,0)*dphi(0,(is+1)%4);
            dphi(1,is) = dphi(1,is%4)*phi((is+1)%4,0)+phi(is%4,0)*dphi(1,(is+1)%4);
        }
        phi(8,0) = phi(0,0)*phi(2,0);
        dphi(0,8) = dphi(0,0)*phi(2,0)+phi(0,0)*dphi(0,2);
        dphi(1,8) = dphi(1,0)*phi(2,0)+phi(0,0)*dphi(1,2);

        // Make the generating shape functions linear and unitary
        for(is=4; is<8; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            phi(is,0) += phi(8,0);
            dphi(0,is) += dphi(0,8);
            dphi(1,is) += dphi(1,8);
            phi(is,0) *= 4.;
            dphi(0,is) *= 4.;
            dphi(1,is) *= 4.;
        }
        phi(8,0) *= 16.;
        dphi(0,8) *= 16.;
        dphi(1,8) *= 16.;
    }